

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPUUtilizationContainer.cpp
# Opt level: O2

void __thiscall GPUUtilizationContainer::GPUUtilizationContainer(GPUUtilizationContainer *this)

{
  int iVar1;
  UtilizationWidget *this_00;
  FlowGridLayout *pFVar2;
  GPUUtDetailsWidget *this_01;
  int gpuId;
  QArrayDataPointer<char16_t> local_40;
  
  UtilizationContainer::UtilizationContainer(&this->super_UtilizationContainer);
  *(undefined ***)&this->super_UtilizationContainer = &PTR_metaObject_00128560;
  *(undefined ***)&(this->super_UtilizationContainer).field_0x10 =
       &PTR__GPUUtilizationContainer_00128710;
  this_00 = (UtilizationWidget *)operator_new(0x2868);
  GPUUtilizationWidget::GPUUtilizationWidget
            ((GPUUtilizationWidget *)this_00,&this->super_UtilizationContainer);
  (this->super_UtilizationContainer).utilizationWidget = this_00;
  QString::QString((QString *)&local_40,"GPU Utilization");
  UtilizationContainer::build(&this->super_UtilizationContainer,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  gpuId = 0;
  while( true ) {
    iVar1 = InfoProvider::getGPUCount();
    if (iVar1 <= gpuId) break;
    pFVar2 = UtilizationContainer::getDescLayout(&this->super_UtilizationContainer);
    this_01 = (GPUUtDetailsWidget *)operator_new(0x28);
    GPUUtDetailsWidget::GPUUtDetailsWidget(this_01,&this->super_UtilizationContainer,gpuId);
    QLayout::addWidget((QWidget *)pFVar2);
    gpuId = gpuId + 1;
  }
  UtilizationContainer::updateLegend(&this->super_UtilizationContainer);
  return;
}

Assistant:

GPUUtilizationContainer::GPUUtilizationContainer() {
    utilizationWidget = new GPUUtilizationWidget(this);
    build("GPU Utilization");

    for (int i = 0; i < InfoProvider::getGPUCount(); i++)
        getDescLayout()->addWidget(new GPUUtDetailsWidget(this, i));

    updateLegend();
}